

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestReporterStdout.cpp
# Opt level: O3

void __thiscall
UnitTest::TestReporterStdout::ReportSummary
          (TestReporterStdout *this,int totalTestCount,int failedTestCount,int failureCount,
          float secondsElapsed)

{
  if (failureCount < 1) {
    printf("Success: %d tests passed.\n",totalTestCount);
  }
  else {
    printf("FAILURE: %d out of %d tests failed (%d failures).\n",(ulong)(uint)failedTestCount,
           totalTestCount);
  }
  printf("Test time: %.2f seconds.\n",(double)secondsElapsed);
  return;
}

Assistant:

void TestReporterStdout::ReportSummary(int const totalTestCount, int const failedTestCount,
                                       int const failureCount, float secondsElapsed)
{
	using namespace std;

    if (failureCount > 0)
        printf("FAILURE: %d out of %d tests failed (%d failures).\n", failedTestCount, totalTestCount, failureCount);
    else
        printf("Success: %d tests passed.\n", totalTestCount);

    printf("Test time: %.2f seconds.\n", secondsElapsed);
}